

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::Binder::GetMatchingBinding
          (Binder *this,string *schema_name,string *table_name,string *column_name,ErrorData *error)

{
  optional_ptr<duckdb::Binding,_true> oVar1;
  string empty_catalog;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  oVar1 = GetMatchingBinding(this,&local_30,schema_name,table_name,column_name,error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (optional_ptr<duckdb::Binding,_true>)oVar1.ptr;
}

Assistant:

optional_ptr<Binding> Binder::GetMatchingBinding(const string &schema_name, const string &table_name,
                                                 const string &column_name, ErrorData &error) {
	string empty_catalog;
	return GetMatchingBinding(empty_catalog, schema_name, table_name, column_name, error);
}